

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportWriteProtection.cpp
# Opt level: O2

bool axl::spy::disableImportWriteProtection(void *module,ImportWriteProtectionBackup *backup)

{
  long lVar1;
  int *piVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  Module *pMVar6;
  size_t __len;
  long lVar7;
  ulong uVar8;
  void *__addr;
  ulong uVar9;
  
  pMVar6 = g::getModule();
  sVar3 = (pMVar6->m_systemInfo).m_pageSize;
  lVar7 = 0;
  do {
    lVar1 = lVar7 + 0x38;
    if ((ulong)*(ushort *)((long)module + 0x2b8) * 0x38 + 0x38 == lVar1) {
      backup->m_p = (void *)0x0;
      backup->m_size = 0;
      (backup->field_2).m_flags = 0;
      return true;
    }
    lVar4 = *(long *)((long)module + 0x2a8);
    piVar2 = (int *)(lVar4 + lVar7);
    lVar7 = lVar1;
  } while (*piVar2 != 0x6474e552);
  uVar8 = *(long *)(lVar4 + -0x28 + lVar1) + *module;
  uVar9 = -sVar3;
  lVar7 = *(long *)(lVar4 + -0x10 + lVar1);
  __addr = (void *)(uVar8 & uVar9);
  backup->m_p = __addr;
  __len = ((sVar3 + lVar7 + uVar8) - 1 & uVar9) - (long)__addr;
  backup->m_size = __len;
  backup->field_2 =
       *(anon_union_4_2_2040755a_for_ImportWriteProtectionBackup_2 *)(lVar4 + -0x34 + lVar1);
  iVar5 = mprotect(__addr,__len,7);
  return iVar5 != -1;
}

Assistant:

bool
disableImportWriteProtection(
	void* module,
	ImportWriteProtectionBackup* backup
) {
	size_t pageSize = g::getModule()->getSystemInfo()->m_pageSize;

	link_map_full* linkMap = (link_map_full*)module;
	for (size_t i = 0; i < linkMap->l_phnum; i++) {
		const ElfW(Phdr)* phdr = &linkMap->l_phdr[i];
		if (phdr->p_type != PT_GNU_RELRO) // read-only-after-relocation (contains GOT)
			continue;

		size_t begin = linkMap->l_addr + phdr->p_vaddr;
		size_t end = begin + phdr->p_memsz;

		begin &= ~(pageSize - 1);
		end = (end + pageSize - 1) & ~(pageSize - 1);

		backup->m_p = (char*)begin;
		backup->m_size = end - begin;
		backup->m_flags = phdr->p_flags;

		int result = ::mprotect(backup->m_p, backup->m_size, PROT_READ | PROT_WRITE | PROT_EXEC);
		return result != -1;
	}

	// GOT not found, still OK

	backup->m_p = NULL;
	backup->m_size = 0;
	backup->m_flags = 0;
	return true;
}